

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

_Bool fy_tag_is_default(char *handle,size_t handle_size,char *prefix,size_t prefix_size)

{
  fy_tag *pfVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  
  if (handle_size == 0xffffffffffffffff) {
    handle_size = strlen(handle);
  }
  if (prefix_size == 0xffffffffffffffff) {
    prefix_size = strlen(prefix);
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pfVar1 = fy_default_tags[lVar5];
    pcVar2 = pfVar1->handle;
    sVar4 = strlen(pcVar2);
    if (handle_size == sVar4) {
      iVar3 = bcmp(handle,pcVar2,handle_size);
      if (iVar3 == 0) {
        pcVar2 = pfVar1->prefix;
        sVar4 = strlen(pcVar2);
        if (prefix_size == sVar4) {
          iVar3 = bcmp(prefix,pcVar2,prefix_size);
          if (iVar3 == 0) break;
        }
      }
    }
  }
  return lVar5 != 3;
}

Assistant:

bool fy_tag_is_default(const char *handle, size_t handle_size,
                       const char *prefix, size_t prefix_size) {
    int i;
    const struct fy_tag *fytag;

    if (handle_size == (size_t) -1)
        handle_size = strlen(handle);

    if (prefix_size == (size_t) -1)
        prefix_size = strlen(prefix);

    for (i = 0; (fytag = fy_default_tags[i]) != NULL; i++) {

        if (handle_size == strlen(fytag->handle) &&
            !memcmp(handle, fytag->handle, handle_size) &&
            prefix_size == strlen(fytag->prefix) &&
            !memcmp(prefix, fytag->prefix, prefix_size))
            return true;

    }
    return false;
}